

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall presolve::HPresolve::changeColLower(HPresolve *this,HighsInt col,double newLower)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  reference this_00;
  char *pcVar5;
  int __c;
  int __c_00;
  int in_ESI;
  iterator *rhs;
  long *in_RDI;
  double in_XMM0_Qa;
  HighsSliceNonzero *nonzero;
  iterator __end1;
  iterator __begin1;
  HighsTripletListSlice *__range1;
  double oldLower;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar6;
  HighsInt in_stack_ffffffffffffff7c;
  HPresolve *in_stack_ffffffffffffff80;
  HighsInt *in_stack_ffffffffffffffa8;
  double in_stack_ffffffffffffffb0;
  HighsInt in_stack_ffffffffffffffb8;
  HighsInt in_stack_ffffffffffffffbc;
  HighsLinearSumBounds *in_stack_ffffffffffffffc0;
  value_type local_18;
  
  pvVar3 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                     ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                      (long)in_ESI);
  local_18 = in_XMM0_Qa;
  if (*pvVar3 != kContinuous) {
    local_18 = ceil(in_XMM0_Qa - (double)in_RDI[4]);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_ESI);
    if ((local_18 == *pvVar4) && (!NAN(local_18) && !NAN(*pvVar4))) {
      return;
    }
  }
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_ESI);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_ESI);
  *pvVar4 = local_18;
  getColumnVector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  HighsMatrixSlice<HighsTripletListSlice>::begin
            ((HighsMatrixSlice<HighsTripletListSlice> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  HighsMatrixSlice<HighsTripletListSlice>::end
            ((HighsMatrixSlice<HighsTripletListSlice> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  while( true ) {
    rhs = (iterator *)&stack0xffffffffffffff78;
    bVar1 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=
                      ((iterator *)&stack0xffffffffffffff98,rhs);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*
                        ((iterator *)&stack0xffffffffffffff98);
    pcVar5 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
    uVar2 = (uint)pcVar5;
    iVar6 = in_ESI;
    HighsSliceNonzero::value(this_00);
    pcVar5 = (char *)(ulong)uVar2;
    HighsLinearSumBounds::updatedVarLower
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
    HighsSliceNonzero::index(this_00,pcVar5,__c_00);
    markChangedRow((HPresolve *)CONCAT44(iVar6,uVar2),(HighsInt)((ulong)(in_RDI + 0x56) >> 0x20));
    HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++
              ((iterator *)&stack0xffffffffffffff98);
  }
  return;
}

Assistant:

void HPresolve::changeColLower(HighsInt col, double newLower) {
  if (model->integrality_[col] != HighsVarType::kContinuous) {
    newLower = std::ceil(newLower - primal_feastol);
    if (newLower == model->col_lower_[col]) return;
  }

  double oldLower = model->col_lower_[col];
  model->col_lower_[col] = newLower;
  // printf("tightening lower bound of column %" HIGHSINT_FORMAT " from %.15g to
  // %.15g\n", col,
  //        oldLower, newLower);

  for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
    impliedRowBounds.updatedVarLower(nonzero.index(), col, nonzero.value(),
                                     oldLower);
    markChangedRow(nonzero.index());
  }
}